

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColUnscaled(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp,int i,
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vec)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 in_RCX;
  int in_EDX;
  int __c;
  int __c_00;
  long in_RSI;
  int j;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int exp2;
  int exp1;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdf0;
  cpp_dec_float<200U,_int,_void> *this_00;
  uint uVar5;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe7c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe80;
  undefined1 local_16c [128];
  undefined1 local_ec [128];
  uint local_6c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_68;
  int local_60;
  int local_5c;
  cpp_dec_float<200U,_int,_void> *local_58;
  DataArray<int> *local_50;
  undefined8 local_48;
  int local_3c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_50 = (DataArray<int> *)(in_RSI + 0x178);
  local_58 = (cpp_dec_float<200U,_int,_void> *)(in_RSI + 0xb0);
  local_48 = in_RCX;
  local_3c = in_EDX;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::colVector((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffdf0,
              (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  piVar3 = DataArray<int>::operator[](local_50,local_3c);
  local_60 = *piVar3;
  local_68 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::colVector(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  iVar1 = local_48._4_4_;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::size(local_68);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(in_stack_fffffffffffffe10,iVar1);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x74d933);
  local_6c = 0;
  while( true ) {
    uVar5 = local_6c;
    iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(local_68);
    if (iVar1 <= (int)uVar5) break;
    this_00 = local_58;
    pcVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(local_68,(char *)(ulong)local_6c,__c);
    piVar3 = DataArray<int>::operator[]((DataArray<int> *)this_00,(int)pcVar4);
    local_5c = *piVar3;
    iVar1 = local_48._4_4_;
    pcVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(local_68,(char *)(ulong)local_6c,__c_00);
    uVar2 = SUB84(pcVar4,0);
    local_28 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_68,local_6c);
    local_20 = &stack0xfffffffffffffe14;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (this_00,(cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    local_10 = local_ec;
    local_18 = local_16c;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (this_00,(cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(uVar5,uVar2),iVar1,
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)this_00);
    local_6c = local_6c + 1;
  }
  return;
}

Assistant:

void SPxScaler<R>::getColUnscaled(const SPxLPBase<R>& lp, int i, DSVectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);
   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   vec = lp.LPColSetBase<R>::colVector(i);

   int exp1;
   int exp2 = colscaleExp[i];

   const SVectorBase<R>& col = lp.colVector(i);
   vec.setMax(col.size());
   vec.clear();

   for(int j = 0; j < col.size(); j++)
   {
      exp1 = rowscaleExp[col.index(j)];
      vec.add(col.index(j), spxLdexp(col.value(j), -exp1 - exp2));
   }
}